

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnMemoryCopy(TypeChecker *this,Limits *src_limits,Limits *dst_limits)

{
  undefined8 uVar1;
  Result RVar2;
  Limits size_limits;
  Limits local_18;
  
  uVar1._0_1_ = src_limits->has_max;
  uVar1._1_1_ = src_limits->is_shared;
  uVar1._2_1_ = src_limits->is_64;
  uVar1._3_5_ = *(undefined5 *)&src_limits->field_0x13;
  local_18._16_3_ = SUB83(uVar1,0);
  local_18.initial = src_limits->initial;
  local_18.max._0_7_ = (undefined7)src_limits->max;
  local_18.max._7_1_ = (undefined1)(src_limits->max >> 0x38);
  if ((src_limits->is_64 == true) && (dst_limits->is_64 == false)) {
    local_18.initial = dst_limits->initial;
    local_18.max._0_7_ = (undefined7)dst_limits->max;
    local_18._16_3_ = SUB43((uint)*(undefined4 *)((long)&dst_limits->max + 7) >> 8,0);
    local_18.max._7_1_ = (undefined1)(dst_limits->max >> 0x38);
  }
  local_18._19_5_ = uVar1._3_5_;
  RVar2 = CheckOpcode3(this,(Opcode)0xcc,src_limits,dst_limits,&local_18);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnMemoryCopy(const Limits& src_limits,
                                 const Limits& dst_limits) {
  Limits size_limits = src_limits;
  // The memory64 proposal specifies that the type of the size argument should
  // be the mimimum of the two memory types.
  if (src_limits.is_64 && !dst_limits.is_64) {
    size_limits = dst_limits;
  }
  return CheckOpcode3(Opcode::MemoryCopy, &src_limits, &dst_limits,
                      &size_limits);
}